

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar35) [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong *puVar45;
  ulong uVar46;
  byte bVar47;
  int iVar48;
  ulong uVar49;
  uint uVar50;
  long lVar51;
  ulong uVar52;
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  NodeRef stack [564];
  undefined1 local_1440 [32];
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar45 = local_11f8;
  local_1200 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar55._4_4_ = fVar2;
  auVar55._0_4_ = fVar2;
  auVar55._8_4_ = fVar2;
  auVar55._12_4_ = fVar2;
  auVar55._16_4_ = fVar2;
  auVar55._20_4_ = fVar2;
  auVar55._24_4_ = fVar2;
  auVar55._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar56._4_4_ = fVar3;
  auVar56._0_4_ = fVar3;
  auVar56._8_4_ = fVar3;
  auVar56._12_4_ = fVar3;
  auVar56._16_4_ = fVar3;
  auVar56._20_4_ = fVar3;
  auVar56._24_4_ = fVar3;
  auVar56._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar57._4_4_ = fVar4;
  auVar57._0_4_ = fVar4;
  auVar57._8_4_ = fVar4;
  auVar57._12_4_ = fVar4;
  auVar57._16_4_ = fVar4;
  auVar57._20_4_ = fVar4;
  auVar57._24_4_ = fVar4;
  auVar57._28_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar62._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar62._8_4_ = -fVar2;
  auVar62._12_4_ = -fVar2;
  auVar62._16_4_ = -fVar2;
  auVar62._20_4_ = -fVar2;
  auVar62._24_4_ = -fVar2;
  auVar62._28_4_ = -fVar2;
  auVar63._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar63._8_4_ = -fVar3;
  auVar63._12_4_ = -fVar3;
  auVar63._16_4_ = -fVar3;
  auVar63._20_4_ = -fVar3;
  auVar63._24_4_ = -fVar3;
  auVar63._28_4_ = -fVar3;
  iVar48 = (tray->tnear).field_0.i[k];
  auVar64._4_4_ = iVar48;
  auVar64._0_4_ = iVar48;
  auVar64._8_4_ = iVar48;
  auVar64._12_4_ = iVar48;
  auVar64._16_4_ = iVar48;
  auVar64._20_4_ = iVar48;
  auVar64._24_4_ = iVar48;
  auVar64._28_4_ = iVar48;
  auVar65._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar4;
  auVar65._12_4_ = -fVar4;
  auVar65._16_4_ = -fVar4;
  auVar65._20_4_ = -fVar4;
  auVar65._24_4_ = -fVar4;
  auVar65._28_4_ = -fVar4;
  iVar48 = (tray->tfar).field_0.i[k];
  auVar66._4_4_ = iVar48;
  auVar66._0_4_ = iVar48;
  auVar66._8_4_ = iVar48;
  auVar66._12_4_ = iVar48;
  auVar66._16_4_ = iVar48;
  auVar66._20_4_ = iVar48;
  auVar66._24_4_ = iVar48;
  auVar66._28_4_ = iVar48;
  bVar54 = true;
  auVar59._8_4_ = 0x7fffffff;
  auVar59._0_8_ = 0x7fffffff7fffffff;
  auVar59._12_4_ = 0x7fffffff;
  auVar59._16_4_ = 0x7fffffff;
  auVar59._20_4_ = 0x7fffffff;
  auVar59._24_4_ = 0x7fffffff;
  auVar59._28_4_ = 0x7fffffff;
  do {
    uVar49 = puVar45[-1];
    puVar45 = puVar45 + -1;
    while ((uVar49 & 8) == 0) {
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar41),auVar62,auVar55);
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar44),auVar63,auVar56);
      auVar70 = vpmaxsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar24));
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar46),auVar65,auVar57);
      auVar60 = vpmaxsd_avx2(ZEXT1632(auVar58),auVar64);
      auVar70 = vpmaxsd_avx2(auVar70,auVar60);
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar41 ^ 0x20)),auVar62,
                                auVar55);
      auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar44 ^ 0x20)),auVar63,
                                auVar56);
      auVar60 = vpminsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar24));
      auVar58 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar46 ^ 0x20)),auVar65,
                                auVar57);
      auVar21 = vpminsd_avx2(ZEXT1632(auVar58),auVar66);
      auVar60 = vpminsd_avx2(auVar60,auVar21);
      auVar70 = vpcmpgtd_avx2(auVar70,auVar60);
      iVar48 = vmovmskps_avx(auVar70);
      if (iVar48 == 0xff) goto LAB_005db1c5;
      bVar47 = ~(byte)iVar48;
      uVar42 = uVar49 & 0xfffffffffffffff0;
      lVar43 = 0;
      for (uVar49 = (ulong)bVar47; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
        lVar43 = lVar43 + 1;
      }
      uVar49 = *(ulong *)(uVar42 + lVar43 * 8);
      uVar50 = bVar47 - 1 & (uint)bVar47;
      uVar52 = (ulong)uVar50;
      if (uVar50 != 0) {
        *puVar45 = uVar49;
        lVar43 = 0;
        for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
          lVar43 = lVar43 + 1;
        }
        uVar50 = uVar50 - 1 & uVar50;
        uVar52 = (ulong)uVar50;
        bVar53 = uVar50 == 0;
        while( true ) {
          puVar45 = puVar45 + 1;
          uVar49 = *(ulong *)(uVar42 + lVar43 * 8);
          if (bVar53) break;
          *puVar45 = uVar49;
          lVar43 = 0;
          for (uVar49 = uVar52; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
            lVar43 = lVar43 + 1;
          }
          uVar52 = uVar52 - 1 & uVar52;
          bVar53 = uVar52 == 0;
        }
      }
    }
    uVar42 = (ulong)((uint)uVar49 & 0xf);
    if (uVar42 != 8) {
      uVar5 = *(undefined4 *)(ray + k * 4);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
      fVar2 = *(float *)(ray + k * 4 + 0x40);
      fVar3 = *(float *)(ray + k * 4 + 0x50);
      uVar49 = uVar49 & 0xfffffffffffffff0;
      fVar4 = *(float *)(ray + k * 4 + 0x60);
      lVar43 = 0;
      do {
        lVar51 = lVar43 * 0xe0;
        lVar1 = uVar49 + 0xc0 + lVar51;
        local_1220 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1218 = *(undefined8 *)(lVar1 + 0x18);
        uStack_1210 = local_1220;
        uStack_1208 = uStack_1218;
        auVar73._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar51);
        auVar73._0_16_ = *(undefined1 (*) [16])(uVar49 + lVar51);
        auVar77._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x70 + lVar51);
        auVar77._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x10 + lVar51);
        auVar75._16_16_ = *(undefined1 (*) [16])(uVar49 + 0x80 + lVar51);
        auVar75._0_16_ = *(undefined1 (*) [16])(uVar49 + 0x20 + lVar51);
        auVar58 = *(undefined1 (*) [16])(uVar49 + 0x30 + lVar51);
        auVar60._16_16_ = auVar58;
        auVar60._0_16_ = auVar58;
        auVar58 = *(undefined1 (*) [16])(uVar49 + 0x40 + lVar51);
        auVar72._16_16_ = auVar58;
        auVar72._0_16_ = auVar58;
        lVar1 = uVar49 + 0x50 + lVar51;
        pauVar35 = (undefined1 (*) [16])(lVar1 + 0x10);
        local_1440._16_8_ = *(undefined8 *)*pauVar35;
        local_1440._0_16_ = *pauVar35;
        local_1440._24_8_ = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar49 + 0x90 + lVar51;
        pauVar35 = (undefined1 (*) [16])(lVar1 + 0x10);
        local_1400._16_8_ = *(undefined8 *)*pauVar35;
        local_1400._0_16_ = *pauVar35;
        local_1400._24_8_ = *(undefined8 *)(lVar1 + 0x18);
        auVar58 = *(undefined1 (*) [16])(uVar49 + 0xa0 + lVar51);
        auVar76._16_16_ = auVar58;
        auVar76._0_16_ = auVar58;
        lVar51 = uVar49 + 0xb0 + lVar51;
        pauVar35 = (undefined1 (*) [16])(lVar51 + 0x10);
        local_13e0._16_8_ = *(undefined8 *)*pauVar35;
        local_13e0._0_16_ = *pauVar35;
        local_13e0._24_8_ = *(undefined8 *)(lVar51 + 0x18);
        auVar60 = vsubps_avx(auVar73,auVar60);
        auVar70 = vsubps_avx(auVar77,auVar72);
        auVar21 = vsubps_avx(auVar75,local_1440);
        auVar8 = vsubps_avx(local_1400,auVar73);
        auVar9 = vsubps_avx(auVar76,auVar77);
        auVar10 = vsubps_avx(local_13e0,auVar75);
        auVar11._4_4_ = auVar70._4_4_ * auVar10._4_4_;
        auVar11._0_4_ = auVar70._0_4_ * auVar10._0_4_;
        auVar11._8_4_ = auVar70._8_4_ * auVar10._8_4_;
        auVar11._12_4_ = auVar70._12_4_ * auVar10._12_4_;
        auVar11._16_4_ = auVar70._16_4_ * auVar10._16_4_;
        auVar11._20_4_ = auVar70._20_4_ * auVar10._20_4_;
        auVar11._24_4_ = auVar70._24_4_ * auVar10._24_4_;
        auVar11._28_4_ = auVar58._12_4_;
        auVar26 = vfmsub231ps_fma(auVar11,auVar9,auVar21);
        auVar12._4_4_ = auVar21._4_4_ * auVar8._4_4_;
        auVar12._0_4_ = auVar21._0_4_ * auVar8._0_4_;
        auVar12._8_4_ = auVar21._8_4_ * auVar8._8_4_;
        auVar12._12_4_ = auVar21._12_4_ * auVar8._12_4_;
        auVar12._16_4_ = auVar21._16_4_ * auVar8._16_4_;
        auVar12._20_4_ = auVar21._20_4_ * auVar8._20_4_;
        auVar12._24_4_ = auVar21._24_4_ * auVar8._24_4_;
        auVar12._28_4_ = auVar9._28_4_;
        auVar27 = vfmsub231ps_fma(auVar12,auVar10,auVar60);
        auVar40._4_4_ = uVar5;
        auVar40._0_4_ = uVar5;
        auVar40._8_4_ = uVar5;
        auVar40._12_4_ = uVar5;
        auVar40._16_4_ = uVar5;
        auVar40._20_4_ = uVar5;
        auVar40._24_4_ = uVar5;
        auVar40._28_4_ = uVar5;
        auVar11 = vsubps_avx(auVar73,auVar40);
        auVar39._4_4_ = uVar6;
        auVar39._0_4_ = uVar6;
        auVar39._8_4_ = uVar6;
        auVar39._12_4_ = uVar6;
        auVar39._16_4_ = uVar6;
        auVar39._20_4_ = uVar6;
        auVar39._24_4_ = uVar6;
        auVar39._28_4_ = uVar6;
        auVar12 = vsubps_avx(auVar77,auVar39);
        auVar13._4_4_ = uVar7;
        auVar13._0_4_ = uVar7;
        auVar13._8_4_ = uVar7;
        auVar13._12_4_ = uVar7;
        auVar13._16_4_ = uVar7;
        auVar13._20_4_ = uVar7;
        auVar13._24_4_ = uVar7;
        auVar13._28_4_ = uVar7;
        auVar13 = vsubps_avx(auVar75,auVar13);
        auVar36._4_4_ = fVar2;
        auVar36._0_4_ = fVar2;
        auVar36._8_4_ = fVar2;
        auVar36._12_4_ = fVar2;
        auVar36._16_4_ = fVar2;
        auVar36._20_4_ = fVar2;
        auVar36._24_4_ = fVar2;
        auVar36._28_4_ = fVar2;
        auVar30._4_4_ = fVar2 * auVar12._4_4_;
        auVar30._0_4_ = fVar2 * auVar12._0_4_;
        auVar30._8_4_ = fVar2 * auVar12._8_4_;
        auVar30._12_4_ = fVar2 * auVar12._12_4_;
        auVar30._16_4_ = fVar2 * auVar12._16_4_;
        auVar30._20_4_ = fVar2 * auVar12._20_4_;
        auVar30._24_4_ = fVar2 * auVar12._24_4_;
        auVar30._28_4_ = auVar13._28_4_;
        auVar38._4_4_ = fVar3;
        auVar38._0_4_ = fVar3;
        auVar38._8_4_ = fVar3;
        auVar38._12_4_ = fVar3;
        auVar38._16_4_ = fVar3;
        auVar38._20_4_ = fVar3;
        auVar38._24_4_ = fVar3;
        auVar38._28_4_ = fVar3;
        auVar58 = vfmsub231ps_fma(auVar30,auVar11,auVar38);
        auVar31._4_4_ = auVar10._4_4_ * auVar58._4_4_;
        auVar31._0_4_ = auVar10._0_4_ * auVar58._0_4_;
        auVar31._8_4_ = auVar10._8_4_ * auVar58._8_4_;
        auVar31._12_4_ = auVar10._12_4_ * auVar58._12_4_;
        auVar31._16_4_ = auVar10._16_4_ * 0.0;
        auVar31._20_4_ = auVar10._20_4_ * 0.0;
        auVar31._24_4_ = auVar10._24_4_ * 0.0;
        auVar31._28_4_ = fVar2;
        auVar67._0_4_ = auVar58._0_4_ * auVar21._0_4_;
        auVar67._4_4_ = auVar58._4_4_ * auVar21._4_4_;
        auVar67._8_4_ = auVar58._8_4_ * auVar21._8_4_;
        auVar67._12_4_ = auVar58._12_4_ * auVar21._12_4_;
        auVar67._16_4_ = auVar21._16_4_ * 0.0;
        auVar67._20_4_ = auVar21._20_4_ * 0.0;
        auVar67._24_4_ = auVar21._24_4_ * 0.0;
        auVar67._28_4_ = 0;
        auVar37._4_4_ = fVar4;
        auVar37._0_4_ = fVar4;
        auVar37._8_4_ = fVar4;
        auVar37._12_4_ = fVar4;
        auVar37._16_4_ = fVar4;
        auVar37._20_4_ = fVar4;
        auVar37._24_4_ = fVar4;
        auVar37._28_4_ = fVar4;
        auVar21._4_4_ = fVar4 * auVar11._4_4_;
        auVar21._0_4_ = fVar4 * auVar11._0_4_;
        auVar21._8_4_ = fVar4 * auVar11._8_4_;
        auVar21._12_4_ = fVar4 * auVar11._12_4_;
        auVar21._16_4_ = fVar4 * auVar11._16_4_;
        auVar21._20_4_ = fVar4 * auVar11._20_4_;
        auVar21._24_4_ = fVar4 * auVar11._24_4_;
        auVar21._28_4_ = auVar10._28_4_;
        auVar24 = vfmsub231ps_fma(auVar21,auVar36,auVar13);
        auVar58 = vfmadd231ps_fma(auVar31,ZEXT1632(auVar24),auVar9);
        local_13a0 = auVar60._0_4_;
        fStack_139c = auVar60._4_4_;
        fStack_1398 = auVar60._8_4_;
        fStack_1394 = auVar60._12_4_;
        fStack_1390 = auVar60._16_4_;
        fStack_138c = auVar60._20_4_;
        fStack_1388 = auVar60._24_4_;
        auVar10._4_4_ = auVar9._4_4_ * fStack_139c;
        auVar10._0_4_ = auVar9._0_4_ * local_13a0;
        auVar10._8_4_ = auVar9._8_4_ * fStack_1398;
        auVar10._12_4_ = auVar9._12_4_ * fStack_1394;
        auVar10._16_4_ = auVar9._16_4_ * fStack_1390;
        auVar10._20_4_ = auVar9._20_4_ * fStack_138c;
        auVar10._24_4_ = auVar9._24_4_ * fStack_1388;
        auVar10._28_4_ = fVar2;
        auVar28 = vfmsub231ps_fma(auVar10,auVar8,auVar70);
        auVar24 = vfmadd231ps_fma(auVar67,auVar70,ZEXT1632(auVar24));
        local_1420 = auVar13._0_4_;
        fStack_141c = auVar13._4_4_;
        fStack_1418 = auVar13._8_4_;
        fStack_1414 = auVar13._12_4_;
        fStack_1410 = auVar13._16_4_;
        fStack_140c = auVar13._20_4_;
        fStack_1408 = auVar13._24_4_;
        auVar74._0_4_ = fVar3 * local_1420;
        auVar74._4_4_ = fVar3 * fStack_141c;
        auVar74._8_4_ = fVar3 * fStack_1418;
        auVar74._12_4_ = fVar3 * fStack_1414;
        auVar74._16_4_ = fVar3 * fStack_1410;
        auVar74._20_4_ = fVar3 * fStack_140c;
        auVar74._24_4_ = fVar3 * fStack_1408;
        auVar74._28_4_ = 0;
        auVar29 = vfmsub231ps_fma(auVar74,auVar37,auVar12);
        auVar70._4_4_ = fVar4 * auVar28._4_4_;
        auVar70._0_4_ = fVar4 * auVar28._0_4_;
        auVar70._8_4_ = fVar4 * auVar28._8_4_;
        auVar70._12_4_ = fVar4 * auVar28._12_4_;
        auVar70._16_4_ = fVar4 * 0.0;
        auVar70._20_4_ = fVar4 * 0.0;
        auVar70._24_4_ = fVar4 * 0.0;
        auVar70._28_4_ = fVar4;
        auVar25 = vfmadd231ps_fma(auVar70,auVar38,ZEXT1632(auVar27));
        auVar9._4_4_ = fVar2;
        auVar9._0_4_ = fVar2;
        auVar9._8_4_ = fVar2;
        auVar9._12_4_ = fVar2;
        auVar9._16_4_ = fVar2;
        auVar9._20_4_ = fVar2;
        auVar9._24_4_ = fVar2;
        auVar9._28_4_ = fVar2;
        auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar9,ZEXT1632(auVar26));
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar29),auVar8);
        auVar8._8_4_ = 0x80000000;
        auVar8._0_8_ = 0x8000000080000000;
        auVar8._12_4_ = 0x80000000;
        auVar8._16_4_ = 0x80000000;
        auVar8._20_4_ = 0x80000000;
        auVar8._24_4_ = 0x80000000;
        auVar8._28_4_ = 0x80000000;
        auVar70 = vandps_avx(ZEXT1632(auVar25),auVar8);
        uVar50 = auVar70._0_4_;
        auVar71._0_4_ = (float)(auVar58._0_4_ ^ uVar50);
        uVar14 = auVar70._4_4_;
        auVar71._4_4_ = (float)(auVar58._4_4_ ^ uVar14);
        uVar15 = auVar70._8_4_;
        auVar71._8_4_ = (float)(auVar58._8_4_ ^ uVar15);
        uVar16 = auVar70._12_4_;
        auVar71._12_4_ = (float)(auVar58._12_4_ ^ uVar16);
        fVar17 = auVar70._16_4_;
        auVar71._16_4_ = fVar17;
        fVar18 = auVar70._20_4_;
        auVar71._20_4_ = fVar18;
        fVar19 = auVar70._24_4_;
        auVar71._24_4_ = fVar19;
        fVar20 = auVar70._28_4_;
        auVar71._28_4_ = fVar20;
        auVar58 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT1632(auVar29),auVar60);
        auVar68._0_4_ = (float)(auVar58._0_4_ ^ uVar50);
        auVar68._4_4_ = (float)(auVar58._4_4_ ^ uVar14);
        auVar68._8_4_ = (float)(auVar58._8_4_ ^ uVar15);
        auVar68._12_4_ = (float)(auVar58._12_4_ ^ uVar16);
        auVar68._16_4_ = fVar17;
        auVar68._20_4_ = fVar18;
        auVar68._24_4_ = fVar19;
        auVar68._28_4_ = fVar20;
        auVar70 = vcmpps_avx(auVar71,ZEXT832(0) << 0x20,5);
        auVar60 = vcmpps_avx(auVar68,ZEXT832(0) << 0x20,5);
        auVar70 = vandps_avx(auVar70,auVar60);
        auVar60 = vcmpps_avx(ZEXT1632(auVar25),ZEXT832(0) << 0x20,4);
        auVar70 = vandps_avx(auVar70,auVar60);
        auVar69._0_4_ = auVar71._0_4_ + auVar68._0_4_;
        auVar69._4_4_ = auVar71._4_4_ + auVar68._4_4_;
        auVar69._8_4_ = auVar71._8_4_ + auVar68._8_4_;
        auVar69._12_4_ = auVar71._12_4_ + auVar68._12_4_;
        auVar69._16_4_ = fVar17 + fVar17;
        auVar69._20_4_ = fVar18 + fVar18;
        auVar69._24_4_ = fVar19 + fVar19;
        auVar69._28_4_ = fVar20 + fVar20;
        auVar60 = vandps_avx(ZEXT1632(auVar25),auVar59);
        auVar21 = vcmpps_avx(auVar69,auVar60,2);
        auVar8 = auVar21 & auVar70;
        if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar8 >> 0x7f,0) != '\0') ||
              (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0xbf,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar8[0x1f] < '\0') {
          auVar70 = vandps_avx(auVar70,auVar21);
          auVar58 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          auVar32._4_4_ = auVar28._4_4_ * fStack_141c;
          auVar32._0_4_ = auVar28._0_4_ * local_1420;
          auVar32._8_4_ = auVar28._8_4_ * fStack_1418;
          auVar32._12_4_ = auVar28._12_4_ * fStack_1414;
          auVar32._16_4_ = fStack_1410 * 0.0;
          auVar32._20_4_ = fStack_140c * 0.0;
          auVar32._24_4_ = fStack_1408 * 0.0;
          auVar32._28_4_ = 0;
          auVar24 = vfmadd132ps_fma(auVar12,auVar32,ZEXT1632(auVar27));
          auVar24 = vfmadd132ps_fma(auVar11,ZEXT1632(auVar24),ZEXT1632(auVar26));
          auVar61._0_4_ = auVar24._0_4_ ^ uVar50;
          auVar61._4_4_ = auVar24._4_4_ ^ uVar14;
          auVar61._8_4_ = auVar24._8_4_ ^ uVar15;
          auVar61._12_4_ = auVar24._12_4_ ^ uVar16;
          auVar61._16_4_ = fVar17;
          auVar61._20_4_ = fVar18;
          auVar61._24_4_ = fVar19;
          auVar61._28_4_ = fVar20;
          fVar17 = *(float *)(ray + k * 4 + 0x30);
          auVar33._4_4_ = auVar60._4_4_ * fVar17;
          auVar33._0_4_ = auVar60._0_4_ * fVar17;
          auVar33._8_4_ = auVar60._8_4_ * fVar17;
          auVar33._12_4_ = auVar60._12_4_ * fVar17;
          auVar33._16_4_ = auVar60._16_4_ * fVar17;
          auVar33._20_4_ = auVar60._20_4_ * fVar17;
          auVar33._24_4_ = auVar60._24_4_ * fVar17;
          auVar33._28_4_ = fVar17;
          auVar70 = vcmpps_avx(auVar33,auVar61,1);
          fVar17 = *(float *)(ray + k * 4 + 0x80);
          auVar34._4_4_ = auVar60._4_4_ * fVar17;
          auVar34._0_4_ = auVar60._0_4_ * fVar17;
          auVar34._8_4_ = auVar60._8_4_ * fVar17;
          auVar34._12_4_ = auVar60._12_4_ * fVar17;
          auVar34._16_4_ = auVar60._16_4_ * fVar17;
          auVar34._20_4_ = auVar60._20_4_ * fVar17;
          auVar34._24_4_ = auVar60._24_4_ * fVar17;
          auVar34._28_4_ = fVar17;
          auVar60 = vcmpps_avx(auVar61,auVar34,2);
          auVar70 = vandps_avx(auVar70,auVar60);
          auVar24 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          auVar58 = vpand_avx(auVar58,auVar24);
          auVar70 = vpmovzxwd_avx2(auVar58);
          auVar70 = vpslld_avx2(auVar70,0x1f);
          if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar70 >> 0x7f,0) != '\0') ||
                (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar70 >> 0xbf,0) != '\0') ||
              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar70[0x1f] < '\0') {
            auVar58 = vpsllw_avx(auVar58,0xf);
            auVar58 = vpacksswb_avx(auVar58,auVar58);
            uVar52 = (ulong)(byte)(SUB161(auVar58 >> 7,0) & 1 | (SUB161(auVar58 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar58 >> 0x3f,0) << 7);
            do {
              uVar22 = 0;
              for (uVar23 = uVar52; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                uVar22 = uVar22 + 1;
              }
              if ((((context->scene->geometries).items[*(uint *)((long)&local_1220 + uVar22 * 4)].
                   ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar54;
              }
              uVar52 = uVar52 ^ 1L << (uVar22 & 0x3f);
            } while (uVar52 != 0);
          }
        }
        lVar43 = lVar43 + 1;
      } while (lVar43 != uVar42 - 8);
    }
LAB_005db1c5:
    bVar54 = puVar45 != &local_1200;
    if (!bVar54) {
      return bVar54;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }